

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer.cc
# Opt level: O1

Expression __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,vector<int,_std::allocator<int>_> *sent,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *labels,ComputationGraph *cg,double *cor,uint *predict,uint *overall,bool train)

{
  pointer *ppiVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pEVar4;
  ComputationGraph *pCVar5;
  pointer ppNVar6;
  undefined1 auVar7 [16];
  int *piVar8;
  undefined1 auVar9 [8];
  Parameters *p;
  RNNBuilder *this_00;
  Expression *x;
  RNNLanguageModel<cnn::FastLSTMBuilder> *pRVar10;
  pointer pvVar11;
  Tensor *pTVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar17;
  ulong uVar18;
  pointer pVVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  undefined1 auVar25 [64];
  undefined1 extraout_var [56];
  undefined1 auVar26 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM2_Qb;
  Expression EVar29;
  undefined7 in_stack_00000019;
  char in_stack_00000020;
  Expression oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i;
  Expression i_charpadding1;
  Expression i_charpadding_1;
  Expression i_wordpadding1;
  Expression i_wordpadding_1;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_char;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_inputw;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charw;
  Expression i_l;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_input;
  Expression input_cols;
  Expression i_charpadding2;
  Expression i_charpadding_2;
  Expression i_wordpadding2;
  Expression i_wordpadding_2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> errs;
  Expression i_lh;
  Expression i_lhbias;
  Expression i_oh2lh;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxExp;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_word;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charPool;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> revs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> fwds;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charinput;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charSum;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxMExp;
  Expression i_lh2l;
  Expression i_u;
  Expression oh2ohxMExp;
  Expression i_oh2ohxMExp;
  Expression i_xMExpbias;
  Expression i_word2xMExp;
  Expression i_charh2xMExp;
  Expression i_charhbias;
  Expression i_charw2charh;
  Expression i_xMExp2xExp;
  Expression combine_h;
  Expression alpha;
  undefined1 local_418 [8];
  pointer pEStack_410;
  ComputationGraph *local_408;
  uint local_400;
  uint uStack_3fc;
  uint local_3f8;
  undefined4 uStack_3f4;
  uint local_3f0;
  ComputationGraph *local_3e8;
  uint local_3e0;
  ComputationGraph *local_3d8;
  uint local_3d0;
  undefined1 local_3c8 [8];
  size_type local_3c0;
  undefined1 local_3b8 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_3a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_398;
  Parameters *local_390;
  undefined8 local_388;
  RNNBuilder *local_380;
  ulong local_378;
  undefined1 local_370 [24];
  uint local_358;
  undefined1 local_350 [24];
  uint local_338;
  pointer local_330;
  ComputationGraph *local_328;
  initializer_list<cnn::expr::Expression> local_320;
  vector<int,_std::allocator<int>_> *local_310;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_308;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2f0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_2d8;
  Expression local_2c0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_298;
  initializer_list<cnn::expr::Expression> local_290;
  undefined1 local_280 [24];
  undefined4 local_268;
  undefined1 local_260 [24];
  undefined4 local_248;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_240;
  Expression *local_228;
  ulong local_220;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_218;
  initializer_list<cnn::expr::Expression> local_200;
  undefined1 local_1f0 [24];
  uint local_1d8;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_1d0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_1b8;
  RNNLanguageModel<cnn::FastLSTMBuilder> *local_1a0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_198;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_180;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_168;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_150;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_138;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_120;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_108;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  undefined4 local_a8;
  undefined1 local_a0 [24];
  uint local_88;
  undefined1 local_80 [24];
  uint local_68;
  Expression local_60;
  Expression local_50;
  Expression local_40;
  
  pvVar2 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = &sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (((ulong)sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 1;
  }
  local_3a0 = labels;
  local_390 = (Parameters *)cor;
  local_380 = (RNNBuilder *)ppiVar1;
  local_328 = cg;
  local_298 = chars;
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,cor);
  local_418 = (undefined1  [8])0x0;
  pEStack_410 = (pointer)0x0;
  local_408 = (ComputationGraph *)0x0;
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_418);
  if (local_418 != (undefined1  [8])0x0) {
    operator_delete((void *)local_418);
  }
  ppiVar1 = &sent[0xf].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  if (((ulong)sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 1;
  }
  local_228 = (Expression *)ppiVar1;
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,local_390);
  local_418 = (undefined1  [8])0x0;
  pEStack_410 = (pointer)0x0;
  local_408 = (ComputationGraph *)0x0;
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_418);
  pVVar19 = (pointer)((long)pvVar2 - (long)pvVar3 >> 2);
  if (local_418 != (undefined1  [8])0x0) {
    operator_delete((void *)local_418);
  }
  p = local_390;
  cnn::expr::parameter((ComputationGraph *)(local_260 + 0x10),local_390);
  cnn::expr::parameter((ComputationGraph *)(local_350 + 0x10),p);
  cnn::expr::parameter((ComputationGraph *)local_260,p);
  cnn::expr::parameter((ComputationGraph *)local_350,p);
  cnn::expr::parameter((ComputationGraph *)(local_280 + 0x10),p);
  cnn::expr::parameter((ComputationGraph *)(local_370 + 0x10),p);
  cnn::expr::parameter((ComputationGraph *)local_280,p);
  cnn::expr::parameter((ComputationGraph *)local_370,p);
  cnn::expr::parameter((ComputationGraph *)(local_80 + 0x10),p);
  cnn::expr::parameter((ComputationGraph *)local_80,p);
  cnn::expr::parameter((ComputationGraph *)(local_a0 + 0x10),p);
  cnn::expr::parameter((ComputationGraph *)local_a0,p);
  cnn::expr::parameter((ComputationGraph *)(local_c0 + 0x10),p);
  cnn::expr::parameter((ComputationGraph *)&local_60,p);
  cnn::expr::parameter((ComputationGraph *)local_c0,p);
  cnn::expr::parameter((ComputationGraph *)local_d0,p);
  cnn::expr::parameter((ComputationGraph *)local_e0,p);
  cnn::expr::parameter((ComputationGraph *)(local_1f0 + 0x10),p);
  cnn::expr::parameter((ComputationGraph *)local_1f0,p);
  cnn::expr::parameter((ComputationGraph *)local_f0,p);
  uVar22 = (ulong)pVVar19 & 0xffffffff;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_1b8,uVar22,(allocator_type *)local_418);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_308,uVar22,(allocator_type *)local_418);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_2d8,uVar22,(allocator_type *)local_418);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_180,uVar22,(allocator_type *)local_418);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_108,uVar22,(allocator_type *)local_418);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_1d0,uVar22,(allocator_type *)local_418);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_120,uVar22,(allocator_type *)local_418);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_198,uVar22,(allocator_type *)local_418);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_138,uVar22,(allocator_type *)local_418);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_2b0,uVar22,(allocator_type *)local_418);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_2f0,uVar22,(allocator_type *)local_418);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_150,uVar22,(allocator_type *)local_418);
  local_1a0 = this;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_168,uVar22,(allocator_type *)local_418);
  local_310 = sent;
  local_220 = uVar22;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_240,uVar22,(allocator_type *)local_418);
  auVar25 = ZEXT864(0) << 0x40;
  local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)pVVar19 != 0) {
    local_388 = (ulong)pVVar19 & 0xffffffff;
    uVar22 = 0;
    local_330 = pVVar19;
    do {
      cnn::expr::lookup((ComputationGraph *)local_418,(LookupParameters *)local_390,
                        (uint)(local_310->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start);
      local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar22].pg = (ComputationGraph *)local_418;
      local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar22].i.t = pEStack_410._0_4_;
      if (eval == false) {
        auVar25 = ZEXT464((uint)pdrop);
        cnn::expr::dropout((expr *)local_418,
                           local_1b8.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar22,pdrop);
        local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar22].pg = (ComputationGraph *)local_418;
        local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar22].i.t = pEStack_410._0_4_;
      }
      pvVar2 = (local_3a0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_378 = uVar22;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_308.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar22,
                 (long)pvVar2[uVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&pvVar2[uVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data >> 2);
      uVar18 = local_378;
      pvVar2 = (local_3a0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pvVar2[local_378].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar2[local_378].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar13 = 0;
        uVar21 = 1;
        do {
          cnn::expr::lookup((ComputationGraph *)local_418,(LookupParameters *)local_390,
                            (uint)(local_310->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                  .super__Vector_impl_data._M_finish);
          pEVar4 = local_308.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pEVar4[uVar13].pg = (ComputationGraph *)local_418;
          pEVar4[uVar13].i.t = pEStack_410._0_4_;
          if (eval == false) {
            auVar25 = ZEXT464((uint)pdrop);
            cnn::expr::dropout((expr *)local_418,
                               local_308.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar18].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar13,pdrop);
            pEVar4 = local_308.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar18].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pEVar4[uVar13].pg = (ComputationGraph *)local_418;
            pEVar4[uVar13].i.t = pEStack_410._0_4_;
          }
          pvVar2 = (local_3a0->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar18;
          bVar23 = uVar21 < (ulong)((long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    *(long *)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>
                                              )._M_impl.super__Vector_impl_data >> 2);
          uVar13 = uVar21;
          uVar21 = (ulong)((int)uVar21 + 1);
        } while (bVar23);
      }
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_2d8.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar22,
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_180.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar22,
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_108.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar22,
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_1d0.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar22,
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      lVar15 = (long)local_308.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar18].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_308.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar18].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pvVar16 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)(uVar22 * 0x10);
      if (lVar15 != 0) {
        pvVar11 = local_308.
                  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar18;
        uVar13 = lVar15 >> 4;
        lVar20 = 0;
        uVar21 = 0;
        local_398 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)(uVar22 * 0x10);
        do {
          dVar24 = auVar25._0_8_;
          if (lVar20 == 0) {
            if (uVar13 < 2) {
              local_418 = (undefined1  [8])local_280._16_8_;
              pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_268);
              local_408 = (ComputationGraph *)local_370._16_8_;
              local_400 = local_358;
              pEVar4 = (pvVar11->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pCVar5 = pEVar4->pg;
              local_3f8 = (uint)pCVar5;
              uStack_3f4 = (undefined4)((ulong)pCVar5 >> 0x20);
              local_3f0 = (pEVar4->i).t;
              local_3e8 = (ComputationGraph *)local_370._0_8_;
              local_3e0 = local_370._8_4_;
              local_3d8 = (ComputationGraph *)local_280._0_8_;
              local_3d0 = local_280._8_4_;
              local_3c0 = 5;
              local_3c8 = (undefined1  [8])local_418;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
            }
            else if (lVar15 == 0x20) {
              local_418 = (undefined1  [8])local_280._16_8_;
              pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_268);
              local_408 = (ComputationGraph *)local_370._16_8_;
              local_400 = local_358;
              pEVar4 = (pvVar11->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_3f8 = (uint)pEVar4->pg;
              uStack_3f4 = (undefined4)((ulong)pEVar4->pg >> 0x20);
              local_3f0 = (pEVar4->i).t;
              local_3e8 = pEVar4[1].pg;
              local_3e0 = pEVar4[1].i.t;
              local_3d8 = (ComputationGraph *)local_370._0_8_;
              local_3d0 = local_370._8_4_;
              local_3c0 = 5;
              local_3c8 = (undefined1  [8])local_418;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
            }
            else {
              local_418 = (undefined1  [8])local_280._16_8_;
              pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_268);
              local_408 = (ComputationGraph *)local_370._16_8_;
              local_400 = local_358;
              pEVar4 = (pvVar11->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_3f8 = (uint)pEVar4->pg;
              uStack_3f4 = (undefined4)((ulong)pEVar4->pg >> 0x20);
              local_3f0 = (pEVar4->i).t;
              local_3e8 = pEVar4[1].pg;
              local_3e0 = pEVar4[1].i.t;
              local_3d8 = pEVar4[2].pg;
              local_3d0 = pEVar4[2].i.t;
              local_3c0 = 5;
              local_3c8 = (undefined1  [8])local_418;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
            }
          }
          else if (lVar20 == 0x10) {
            if (uVar21 + 1 < uVar13) {
              if (uVar13 < 4) {
                local_418 = (undefined1  [8])local_370._16_8_;
                pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_358);
                pEVar4 = (pvVar11->
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_408 = pEVar4->pg;
                local_400 = (pEVar4->i).t;
                local_3f8 = (uint)pEVar4[1].pg;
                uStack_3f4 = (undefined4)((ulong)pEVar4[1].pg >> 0x20);
                local_3f0 = pEVar4[1].i.t;
                local_3e8 = pEVar4[2].pg;
                local_3e0 = pEVar4[2].i.t;
                local_3d8 = (ComputationGraph *)local_370._0_8_;
                local_3d0 = local_370._8_4_;
                local_3c0 = 5;
                local_3c8 = (undefined1  [8])local_418;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8)
                ;
              }
              else {
                local_418 = (undefined1  [8])local_370._16_8_;
                pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_358);
                pEVar4 = (pvVar11->
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_408 = pEVar4->pg;
                local_400 = (pEVar4->i).t;
                local_3f8 = (uint)pEVar4[1].pg;
                uStack_3f4 = (undefined4)((ulong)pEVar4[1].pg >> 0x20);
                local_3f0 = pEVar4[1].i.t;
                local_3e8 = pEVar4[2].pg;
                local_3e0 = pEVar4[2].i.t;
                local_3d8 = pEVar4[3].pg;
                local_3d0 = pEVar4[3].i.t;
                local_3c0 = 5;
                local_3c8 = (undefined1  [8])local_418;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8)
                ;
              }
            }
            else {
              local_418 = (undefined1  [8])local_370._16_8_;
              pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_358);
              pEVar4 = (pvVar11->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_408 = pEVar4->pg;
              local_400 = (pEVar4->i).t;
              local_3f8 = (uint)pEVar4[1].pg;
              uStack_3f4 = (undefined4)((ulong)pEVar4[1].pg >> 0x20);
              local_3f0 = pEVar4[1].i.t;
              local_3e8 = (ComputationGraph *)local_370._0_8_;
              local_3e0 = local_370._8_4_;
              local_3d8 = (ComputationGraph *)local_280._0_8_;
              local_3d0 = local_280._8_4_;
              local_3c0 = 5;
              local_3c8 = (undefined1  [8])local_418;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
            }
          }
          else if (uVar21 + 1 < uVar13) {
            if (uVar21 + 2 < uVar13) {
              pEVar4 = (pvVar11->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_418 = *(undefined1 (*) [8])((long)&pEVar4[-2].pg + lVar20);
              pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                              *(undefined4 *)((long)pEVar4 + lVar20 + -0x18));
              local_408 = *(ComputationGraph **)((long)&pEVar4[-1].pg + lVar20);
              local_400 = *(uint *)((long)pEVar4 + lVar20 + -8);
              uVar17 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
              local_3f8 = (uint)uVar17;
              uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
              local_3f0 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
              local_3e8 = *(ComputationGraph **)((long)&pEVar4[1].pg + lVar20);
              local_3e0 = *(uint *)((long)&pEVar4[1].i.t + lVar20);
              local_3d8 = *(ComputationGraph **)((long)&pEVar4[2].pg + lVar20);
              local_3d0 = *(uint *)((long)&pEVar4[2].i.t + lVar20);
              local_3c0 = 5;
              local_3c8 = (undefined1  [8])local_418;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
            }
            else {
              pEVar4 = (pvVar11->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_418 = *(undefined1 (*) [8])((long)&pEVar4[-2].pg + lVar20);
              pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                              *(undefined4 *)((long)pEVar4 + lVar20 + -0x18));
              local_408 = *(ComputationGraph **)((long)&pEVar4[-1].pg + lVar20);
              local_400 = *(uint *)((long)pEVar4 + lVar20 + -8);
              uVar17 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
              local_3f8 = (uint)uVar17;
              uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
              local_3f0 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
              local_3e8 = *(ComputationGraph **)((long)&pEVar4[1].pg + lVar20);
              local_3e0 = *(uint *)((long)&pEVar4[1].i.t + lVar20);
              local_3d8 = (ComputationGraph *)local_370._0_8_;
              local_3d0 = local_370._8_4_;
              local_3c0 = 5;
              local_3c8 = (undefined1  [8])local_418;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
            }
          }
          else {
            pEVar4 = (pvVar11->
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_418 = *(undefined1 (*) [8])((long)&pEVar4[-2].pg + lVar20);
            pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                            *(undefined4 *)((long)pEVar4 + lVar20 + -0x18));
            local_408 = *(ComputationGraph **)((long)&pEVar4[-1].pg + lVar20);
            local_400 = *(uint *)((long)pEVar4 + lVar20 + -8);
            uVar17 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
            local_3f8 = (uint)uVar17;
            uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
            local_3f0 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
            local_3e8 = (ComputationGraph *)local_370._0_8_;
            local_3e0 = local_370._8_4_;
            local_3d8 = (ComputationGraph *)local_280._0_8_;
            local_3d0 = local_280._8_4_;
            local_3c0 = 5;
            local_3c8 = (undefined1  [8])local_418;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
          }
          pEVar4 = local_2d8.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar4->pg + lVar20) = local_3b8._0_8_;
          *(undefined4 *)((long)&(pEVar4->i).t + lVar20) = local_3b8._8_4_;
          local_418 = (undefined1  [8])local_80._0_8_;
          local_408 = (ComputationGraph *)local_80._16_8_;
          local_400 = local_68;
          pEVar4 = local_2d8.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
          local_3f8 = (uint)uVar17;
          uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
          local_3f0 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
          local_290._M_len = 3;
          local_290._M_array = (iterator)local_418;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,&local_290);
          dVar24 = cnn::expr::tanh((expr *)local_3b8,dVar24);
          pEVar4 = local_180.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar4->pg + lVar20) = local_3b8._0_8_;
          *(undefined4 *)((long)&(pEVar4->i).t + lVar20) = local_3b8._8_4_;
          local_418 = (undefined1  [8])local_c0._16_8_;
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_a8);
          local_408 = (ComputationGraph *)local_a0._16_8_;
          local_400 = local_88;
          pEVar4 = local_180.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
          local_3f8 = (uint)uVar17;
          uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
          local_3f0 = *(uint *)((long)&(pEVar4->i).t + lVar20);
          local_3e8 = (ComputationGraph *)local_a0._0_8_;
          local_3e0 = local_a0._8_4_;
          local_3d8 = *(ComputationGraph **)
                       ((long)&(local_1b8.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg + (long)local_398);
          local_3d0 = *(uint *)((long)&((local_1b8.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t +
                               (long)local_398);
          local_290._M_len = 5;
          local_290._M_array = (iterator)local_418;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,&local_290);
          dVar24 = cnn::expr::tanh((expr *)local_3b8,dVar24);
          pEVar4 = local_108.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar4->pg + lVar20) = local_3b8._0_8_;
          *(undefined4 *)((long)&(pEVar4->i).t + lVar20) = local_3b8._8_4_;
          cnn::expr::operator*
                    ((expr *)local_3b8,&local_60,
                     (Expression *)
                     ((long)&(local_108.
                              super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar18].
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20));
          auVar25._0_8_ = cnn::expr::exp((expr *)local_418,dVar24);
          auVar25._8_56_ = extraout_var;
          pEVar4 = local_1d0.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar22].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined1 (*) [8])((long)&pEVar4->pg + lVar20) = local_418;
          *(uint *)((long)&(pEVar4->i).t + lVar20) = pEStack_410._0_4_;
          uVar21 = uVar21 + 1;
          pvVar11 = local_308.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar22;
          lVar15 = (long)local_308.
                         super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar22].
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_308.
                         super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar22].
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = lVar15 >> 4;
          lVar20 = lVar20 + 0x10;
          pvVar16 = local_398;
        } while (uVar21 < uVar13);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_418,
                 local_1d0.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar18);
      *(undefined1 (*) [8])
       ((long)&(local_120.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + (long)pvVar16) = local_418;
      *(uint *)((long)&((local_120.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + (long)pvVar16) =
           pEStack_410._0_4_;
      local_398 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)(uVar18 * 0x18);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_198.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar22,
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_308.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (local_308.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar18].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_308.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar18].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar18 = 0;
        uVar13 = 1;
        do {
          pEVar4 = local_180.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar22].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          cnn::expr::cdiv((expr *)local_3b8,
                          local_1d0.
                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar22].
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar18,
                          (Expression *)
                          ((long)&(local_120.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + (long)pvVar16));
          cnn::expr::cwise_multiply((expr *)local_418,pEVar4 + uVar18,(Expression *)local_3b8);
          pEVar4 = local_198.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar22].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pEVar4[uVar18].pg = (ComputationGraph *)local_418;
          pEVar4[uVar18].i.t = pEStack_410._0_4_;
          bVar23 = uVar13 < (ulong)((long)local_308.
                                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_308.
                                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar18 = uVar13;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (bVar23);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_418,
                 (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 ((long)&(local_398->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                 (long)local_198.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
      *(undefined1 (*) [8])
       ((long)&(local_138.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + (long)pvVar16) = local_418;
      *(uint *)((long)&((local_138.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + (long)pvVar16) =
           pEStack_410._0_4_;
      uVar22 = local_378 + 1;
    } while (uVar22 != local_388);
    lVar15 = local_388 << 4;
    lVar20 = 0;
    do {
      local_418 = *(undefined1 (*) [8])
                   ((long)&(local_138.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20);
      pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                      *(undefined4 *)
                                       ((long)&((local_138.
                                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                       lVar20));
      local_408 = *(ComputationGraph **)
                   ((long)&(local_1b8.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20);
      local_400 = *(uint *)((long)&((local_1b8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar20);
      local_3c0 = 2;
      local_3c8 = (undefined1  [8])local_418;
      cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
      *(undefined8 *)
       ((long)&(local_2b0.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar20) = local_3b8._0_8_;
      *(undefined4 *)
       ((long)&((local_2b0.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start)->i).t + lVar20) = local_3b8._8_4_;
      lVar20 = lVar20 + 0x10;
    } while (lVar15 != lVar20);
    uVar18 = (ulong)local_330 & 0xffffffff;
    uVar22 = 2;
    lVar20 = 0;
    do {
      if (lVar20 == 0) {
        if ((uint)local_330 == 2) {
          local_418 = (undefined1  [8])local_260._16_8_;
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_248);
          local_408 = (ComputationGraph *)local_350._16_8_;
          local_400 = local_338;
          local_3f8 = (uint)(local_2b0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg;
          uStack_3f4 = (undefined4)
                       ((ulong)(local_2b0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
          local_3f0 = ((local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_3e8 = local_2b0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].pg;
          local_3e0 = local_2b0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].i.t;
          local_3d8 = (ComputationGraph *)local_350._0_8_;
          local_3d0 = local_350._8_4_;
          local_3c0 = 5;
          local_3c8 = (undefined1  [8])local_418;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
        }
        else if ((uint)local_330 == 1) {
          local_418 = (undefined1  [8])local_260._16_8_;
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_248);
          local_408 = (ComputationGraph *)local_350._16_8_;
          local_400 = local_338;
          local_3f8 = (uint)(local_2b0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg;
          uStack_3f4 = (undefined4)
                       ((ulong)(local_2b0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
          local_3f0 = ((local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_3e8 = (ComputationGraph *)local_350._0_8_;
          local_3e0 = local_350._8_4_;
          local_3d8 = (ComputationGraph *)local_260._0_8_;
          local_3d0 = local_260._8_4_;
          local_3c0 = 5;
          local_3c8 = (undefined1  [8])local_418;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
        }
        else {
          local_418 = (undefined1  [8])local_260._16_8_;
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_248);
          local_408 = (ComputationGraph *)local_350._16_8_;
          local_400 = local_338;
          local_3f8 = (uint)(local_2b0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg;
          uStack_3f4 = (undefined4)
                       ((ulong)(local_2b0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
          local_3f0 = ((local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_3e8 = local_2b0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].pg;
          local_3e0 = local_2b0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].i.t;
          local_3d8 = local_2b0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].pg;
          local_3d0 = local_2b0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].i.t;
          local_3c0 = 5;
          local_3c8 = (undefined1  [8])local_418;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
        }
      }
      else if (lVar20 == 0x10) {
        if (uVar22 - 1 < uVar18) {
          if ((uint)local_330 < 4) {
            local_418 = (undefined1  [8])local_350._16_8_;
            pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_338);
            local_408 = (local_2b0.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pg;
            local_400 = ((local_2b0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->i).t;
            local_3f8 = (uint)local_2b0.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].pg;
            uStack_3f4 = (undefined4)
                         ((ulong)local_2b0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
            local_3f0 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].i.t;
            local_3e8 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].pg;
            local_3e0 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].i.t;
            local_3d8 = (ComputationGraph *)local_350._0_8_;
            local_3d0 = local_350._8_4_;
            local_3c0 = 5;
            local_3c8 = (undefined1  [8])local_418;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
          }
          else {
            local_418 = (undefined1  [8])local_350._16_8_;
            pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_338);
            local_408 = (local_2b0.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pg;
            local_400 = ((local_2b0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->i).t;
            local_3f8 = (uint)local_2b0.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].pg;
            uStack_3f4 = (undefined4)
                         ((ulong)local_2b0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
            local_3f0 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].i.t;
            local_3e8 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].pg;
            local_3e0 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].i.t;
            local_3d8 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].pg;
            local_3d0 = local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].i.t;
            local_3c0 = 5;
            local_3c8 = (undefined1  [8])local_418;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
          }
        }
        else {
          local_418 = (undefined1  [8])local_350._16_8_;
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_338);
          local_408 = (local_2b0.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
          local_400 = ((local_2b0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_3f8 = (uint)local_2b0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].pg;
          uStack_3f4 = (undefined4)
                       ((ulong)local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
          local_3f0 = local_2b0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].i.t;
          local_3e8 = (ComputationGraph *)local_350._0_8_;
          local_3e0 = local_350._8_4_;
          local_3d8 = (ComputationGraph *)local_260._0_8_;
          local_3d0 = local_260._8_4_;
          local_3c0 = 5;
          local_3c8 = (undefined1  [8])local_418;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
        }
      }
      else if (uVar22 - 1 < uVar18) {
        if (uVar22 < uVar18) {
          local_418 = *(undefined1 (*) [8])
                       ((long)&local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar20);
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                          *(undefined4 *)
                                           ((long)local_2b0.
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar20 + -0x18));
          local_408 = *(ComputationGraph **)
                       ((long)&local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar20);
          local_400 = *(uint *)((long)local_2b0.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
          uVar17 = *(undefined8 *)
                    ((long)&(local_2b0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20);
          local_3f8 = (uint)uVar17;
          uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
          local_3f0 = *(uint *)((long)&((local_2b0.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar20);
          local_3e8 = *(ComputationGraph **)
                       ((long)&local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar20);
          local_3e0 = *(uint *)((long)&local_2b0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].i.t + lVar20);
          local_3d8 = *(ComputationGraph **)
                       ((long)&local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].pg + lVar20);
          local_3d0 = *(uint *)((long)&local_2b0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start[2].i.t + lVar20);
          local_3c0 = 5;
          local_3c8 = (undefined1  [8])local_418;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
        }
        else {
          local_418 = *(undefined1 (*) [8])
                       ((long)&local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar20);
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                          *(undefined4 *)
                                           ((long)local_2b0.
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar20 + -0x18));
          local_408 = *(ComputationGraph **)
                       ((long)&local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar20);
          local_400 = *(uint *)((long)local_2b0.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
          uVar17 = *(undefined8 *)
                    ((long)&(local_2b0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20);
          local_3f8 = (uint)uVar17;
          uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
          local_3f0 = *(uint *)((long)&((local_2b0.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar20);
          local_3e8 = *(ComputationGraph **)
                       ((long)&local_2b0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar20);
          local_3e0 = *(uint *)((long)&local_2b0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].i.t + lVar20);
          local_3d8 = (ComputationGraph *)local_350._0_8_;
          local_3d0 = local_350._8_4_;
          local_3c0 = 5;
          local_3c8 = (undefined1  [8])local_418;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
        }
      }
      else {
        local_418 = *(undefined1 (*) [8])
                     ((long)&local_2b0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar20);
        pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                        *(undefined4 *)
                                         ((long)local_2b0.
                                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar20 + -0x18));
        local_408 = *(ComputationGraph **)
                     ((long)&local_2b0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar20);
        local_400 = *(uint *)((long)local_2b0.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
        uVar17 = *(undefined8 *)
                  ((long)&(local_2b0.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20);
        local_3f8 = (uint)uVar17;
        uStack_3f4 = (undefined4)((ulong)uVar17 >> 0x20);
        local_3f0 = *(uint *)((long)&((local_2b0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar20);
        local_3e8 = (ComputationGraph *)local_350._0_8_;
        local_3e0 = local_350._8_4_;
        local_3d8 = (ComputationGraph *)local_260._0_8_;
        local_3d0 = local_260._8_4_;
        local_3c0 = 5;
        local_3c8 = (undefined1  [8])local_418;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
      }
      x = local_228;
      uVar13 = local_388;
      *(undefined8 *)
       ((long)&(local_2f0.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar20) = local_3b8._0_8_;
      *(undefined4 *)
       ((long)&((local_2f0.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start)->i).t + lVar20) = local_3b8._8_4_;
      lVar20 = lVar20 + 0x10;
      uVar22 = uVar22 + 1;
    } while (lVar15 != lVar20);
    lVar20 = 0;
    do {
      cnn::RNNBuilder::add_input((RNNBuilder *)local_418,(Expression *)local_380);
      *(undefined1 (*) [8])
       ((long)&(local_150.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar20) = local_418;
      *(uint *)((long)&((local_150.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar20) =
           pEStack_410._0_4_;
      lVar20 = lVar20 + 0x10;
      pVVar19 = local_330;
    } while (lVar15 != lVar20);
    do {
      pVVar19 = (pointer)((long)&pVVar19[-1].t + 3);
      uVar22 = (ulong)pVVar19 & 0xffffffff;
      cnn::RNNBuilder::add_input((RNNBuilder *)local_418,x);
      local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar22].pg = (ComputationGraph *)local_418;
      local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar22].i.t = pEStack_410._0_4_;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    lVar20 = 0;
    do {
      local_418 = *(undefined1 (*) [8])
                   ((long)&(local_150.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20);
      pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,
                                      *(undefined4 *)
                                       ((long)&((local_150.
                                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                       lVar20));
      local_408 = *(ComputationGraph **)
                   ((long)&(local_168.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20);
      local_400 = *(uint *)((long)&((local_168.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar20);
      local_3c0 = 2;
      local_3c8 = (undefined1  [8])local_418;
      EVar29 = cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                         ((detail *)local_3b8,(initializer_list<cnn::expr::Expression> *)local_3c8);
      pvVar16 = EVar29._8_8_;
      *(undefined8 *)
       ((long)&(local_240.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar20) = local_3b8._0_8_;
      *(undefined4 *)
       ((long)&((local_240.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start)->i).t + lVar20) = local_3b8._8_4_;
      lVar20 = lVar20 + 0x10;
    } while (lVar15 != lVar20);
    local_380 = (RNNBuilder *)(local_310 + 0x18);
    local_298 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)((ulong)local_330 & 0xffffffff);
    lVar15 = (long)local_298 << 4;
    local_398 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)0x0;
    do {
      this_00 = local_380;
      if (((ulong)local_310[0x18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish & 0xfffffffd00000000) == 0) {
        *(undefined4 *)
         ((long)&local_310[0x18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 4) = 1;
      }
      (*local_380->_vptr_RNNBuilder[9])(local_380,local_390,pvVar16);
      auVar26 = ZEXT864(0) << 0x40;
      local_418 = (undefined1  [8])0x0;
      pEStack_410 = (pointer)0x0;
      local_408 = (ComputationGraph *)0x0;
      cnn::RNNBuilder::start_new_sequence
                (this_00,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                         local_418);
      if (local_418 != (undefined1  [8])0x0) {
        operator_delete((void *)local_418);
      }
      if (in_stack_00000020 == '\0') {
        uStack_3fc = 1;
        local_3f8 = 1;
        local_418._0_4_ = HIDDEN_DIM;
        cnn::expr::zeroes((expr *)local_3c8,(ComputationGraph *)local_390,(Dim *)local_418);
        local_3a0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)((ulong)local_3a0 & 0xffffffff00000000);
        do {
          if (0xc < (int)local_3a0) break;
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     local_3b8,local_220,(allocator_type *)local_418);
          lVar20 = 0;
          do {
            dVar24 = auVar26._0_8_;
            cnn::expr::operator*
                      ((expr *)&local_50,(Expression *)local_c0,
                       (Expression *)
                       ((long)&(local_240.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20));
            cnn::expr::operator*((expr *)&local_200,(Expression *)local_d0,(Expression *)local_3c8);
            cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_200);
            auVar26._0_8_ = cnn::expr::tanh((expr *)&local_290,dVar24);
            auVar26._8_56_ = extraout_var_02;
            cnn::expr::operator*((expr *)local_418,(Expression *)local_e0,(Expression *)&local_290);
            dVar24 = auVar26._0_8_;
            *(undefined1 (*) [8])
             ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)local_3b8._0_8_)->
                     super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar20) = local_418;
            *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)local_3b8._0_8_)
                             ->super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish + lVar20) = pEStack_410._0_4_
            ;
            lVar20 = lVar20 + 0x10;
          } while (lVar15 != lVar20);
          cnn::expr::detail::
          f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                    ((detail *)&local_290,&local_240);
          cnn::expr::detail::
          f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                    ((detail *)local_418,
                     (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     local_3b8);
          cnn::expr::softmax((expr *)&local_40,(Expression *)local_418);
          cnn::expr::transpose((expr *)&local_200,&local_40);
          cnn::expr::transpose((expr *)&local_2c0,(Expression *)&local_290);
          cnn::expr::operator*((expr *)&local_50,(Expression *)&local_200,&local_2c0);
          cnn::expr::transpose((expr *)local_418,&local_50);
          local_408 = (ComputationGraph *)local_418;
          local_400 = pEStack_410._0_4_;
          local_200._M_len = 2;
          local_418 = (undefined1  [8])
                      local_240.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)local_398].pg;
          local_200._M_array = (iterator)local_418;
          pEStack_410._0_4_ =
               local_240.
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)local_398].i.t;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&local_50,&local_200);
          cnn::RNNBuilder::add_input((RNNBuilder *)local_418,(Expression *)local_380);
          local_3f0 = pEStack_410._0_4_;
          auVar9 = local_418;
          local_3c8 = local_418;
          local_3c0 = CONCAT44(local_3c0._4_4_,pEStack_410._0_4_);
          local_418 = (undefined1  [8])local_1f0._0_8_;
          pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_1f0._8_4_);
          local_408 = (ComputationGraph *)local_1f0._16_8_;
          local_400 = local_1d8;
          local_3f8 = auVar9._0_4_;
          uStack_3f4 = auVar9._4_4_;
          local_320._M_len = 3;
          local_320._M_array = (iterator)local_418;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&local_2c0,&local_320);
          auVar26._0_8_ = cnn::expr::tanh((expr *)&local_200,dVar24);
          auVar26._8_56_ = extraout_var_03;
          cnn::expr::operator*((expr *)&local_2c0,(Expression *)local_f0,(Expression *)&local_200);
          if (predict == (uint *)0x0) {
            bVar23 = true;
          }
          else {
            pTVar12 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)local_390);
            cnn::as_vector((vector<float,_std::allocator<float>_> *)local_418,pTVar12);
            if ((long)pEStack_410 - (long)local_418 == 0) {
              uVar14 = 0xffffffff;
            }
            else {
              lVar20 = (long)pEStack_410 - (long)local_418 >> 2;
              uVar18 = 0xffffffff;
              uVar22 = 0;
              auVar26 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
              do {
                auVar28._0_8_ =
                     (double)*(float *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_418)->
                                               super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start +
                                       uVar22 * 4);
                auVar28._8_8_ = in_XMM2_Qb;
                dVar24 = auVar26._0_8_;
                auVar7 = vmaxsd_avx(auVar28,auVar26._0_16_);
                auVar26 = ZEXT1664(auVar7);
                if (dVar24 < auVar28._0_8_) {
                  uVar18 = uVar22 & 0xffffffff;
                }
                uVar14 = (uint)uVar18;
                uVar22 = uVar22 + 1;
              } while (lVar20 + (ulong)(lVar20 == 0) != uVar22);
            }
            ppNVar6 = (local_328->nodes).
                      super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)local_398 * 3;
            uVar22 = (ulong)(int)local_3a0;
            uVar18 = (long)ppNVar6[1] - (long)*ppNVar6 >> 2;
            if (uVar22 < uVar18) {
              if (((*ppNVar6)->dim).d[uVar22 - 8] == uVar14) {
                auVar26 = ZEXT864((ulong)(*(double *)predict + 1.0));
                *(double *)predict = *(double *)predict + 1.0;
              }
              if (uVar18 <= uVar22) goto LAB_00166845;
              cnn::expr::pickneglogsoftmax
                        ((expr *)&local_320,&local_2c0,((*ppNVar6)->dim).d[uVar22 - 8]);
              std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
              emplace_back<cnn::expr::Expression>(&local_218,(Expression *)&local_320);
            }
            else {
LAB_00166845:
              cnn::expr::pickneglogsoftmax
                        ((expr *)&local_320,&local_2c0,*(uint *)((long)&ppNVar6[1][-1].aux_mem + 4))
              ;
              std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
              emplace_back<cnn::expr::Expression>(&local_218,(Expression *)&local_320);
            }
            bVar23 = uVar14 != endlabel;
            if (local_418 != (undefined1  [8])0x0) {
              operator_delete((void *)local_418);
            }
            local_3a0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)CONCAT44(local_3a0._4_4_,(int)local_3a0 + 1);
          }
          if ((ComputationGraph *)local_3b8._0_8_ != (ComputationGraph *)0x0) {
            operator_delete((void *)local_3b8._0_8_);
          }
        } while (bVar23);
        if (overall != (uint *)0x0) {
          *overall = *overall + (int)local_3a0;
        }
        piVar8 = (int *)CONCAT71(in_stack_00000019,train);
        pvVar16 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_418;
        if (piVar8 != (int *)0x0) {
          ppNVar6 = (local_328->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar16 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)((ulong)((long)ppNVar6[(long)local_398 * 3 + 1] -
                               (long)ppNVar6[(long)local_398 * 3]) >> 2);
          *piVar8 = *piVar8 + (int)pvVar16;
        }
      }
      else {
        uStack_3fc = 1;
        local_3f8 = 1;
        local_418._0_4_ = HIDDEN_DIM;
        cnn::expr::zeroes((expr *)local_3c8,(ComputationGraph *)local_390,(Dim *)local_418);
        ppNVar6 = (local_328->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_3a0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)((long)local_398 * 3);
        if (ppNVar6[(long)local_398 * 3 + 1] == ppNVar6[(long)local_398 * 3]) {
          uVar22 = 0;
          local_388 = (ulong)local_388._4_4_ << 0x20;
        }
        else {
          local_378 = 0;
          local_388 = (ulong)local_388._4_4_ << 0x20;
          do {
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                      ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       local_3b8,local_220,(allocator_type *)local_418);
            lVar20 = 0;
            do {
              dVar24 = auVar26._0_8_;
              cnn::expr::operator*
                        ((expr *)&local_50,(Expression *)local_c0,
                         (Expression *)
                         ((long)&(local_240.
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20));
              cnn::expr::operator*
                        ((expr *)&local_200,(Expression *)local_d0,(Expression *)local_3c8);
              cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_200);
              auVar26._0_8_ = cnn::expr::tanh((expr *)&local_290,dVar24);
              auVar26._8_56_ = extraout_var_00;
              cnn::expr::operator*
                        ((expr *)local_418,(Expression *)local_e0,(Expression *)&local_290);
              dVar24 = auVar26._0_8_;
              *(undefined1 (*) [8])
               ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)local_3b8._0_8_)->
                       super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar20) = local_418;
              *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                local_3b8._0_8_)->
                               super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar20) =
                   pEStack_410._0_4_;
              lVar20 = lVar20 + 0x10;
            } while (lVar15 != lVar20);
            cnn::expr::detail::
            f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                      ((detail *)&local_290,&local_240);
            cnn::expr::detail::
            f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                      ((detail *)local_418,
                       (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       local_3b8);
            cnn::expr::softmax((expr *)&local_40,(Expression *)local_418);
            cnn::expr::transpose((expr *)&local_200,&local_40);
            cnn::expr::transpose((expr *)&local_2c0,(Expression *)&local_290);
            cnn::expr::operator*((expr *)&local_50,(Expression *)&local_200,&local_2c0);
            cnn::expr::transpose((expr *)local_418,&local_50);
            local_408 = (ComputationGraph *)local_418;
            local_400 = pEStack_410._0_4_;
            local_200._M_len = 2;
            local_418 = (undefined1  [8])
                        local_240.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)local_398].pg;
            local_200._M_array = (iterator)local_418;
            pEStack_410._0_4_ =
                 local_240.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)local_398].i.t;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&local_50,&local_200);
            cnn::RNNBuilder::add_input((RNNBuilder *)local_418,(Expression *)local_380);
            local_3f0 = pEStack_410._0_4_;
            auVar9 = local_418;
            local_3c8 = local_418;
            local_3c0 = CONCAT44(local_3c0._4_4_,pEStack_410._0_4_);
            local_418 = (undefined1  [8])local_1f0._0_8_;
            pEStack_410 = (pointer)CONCAT44(pEStack_410._4_4_,local_1f0._8_4_);
            local_408 = (ComputationGraph *)local_1f0._16_8_;
            local_400 = local_1d8;
            local_3f8 = auVar9._0_4_;
            uStack_3f4 = auVar9._4_4_;
            local_320._M_len = 3;
            local_320._M_array = (iterator)local_418;
            cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&local_2c0,&local_320);
            auVar26._0_8_ = cnn::expr::tanh((expr *)&local_200,dVar24);
            auVar26._8_56_ = extraout_var_01;
            cnn::expr::operator*((expr *)&local_2c0,(Expression *)local_f0,(Expression *)&local_200)
            ;
            if (predict != (uint *)0x0) {
              pTVar12 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)local_390);
              cnn::as_vector((vector<float,_std::allocator<float>_> *)local_418,pTVar12);
              if ((long)pEStack_410 - (long)local_418 == 0) {
                uVar14 = 0xffffffff;
              }
              else {
                lVar20 = (long)pEStack_410 - (long)local_418 >> 2;
                uVar22 = 0xffffffff;
                uVar18 = 0;
                auVar26 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
                do {
                  auVar27._0_8_ =
                       (double)*(float *)((long)&(((
                                                  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_418)->
                                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start +
                                         uVar18 * 4);
                  auVar27._8_8_ = in_XMM2_Qb;
                  dVar24 = auVar26._0_8_;
                  auVar7 = vmaxsd_avx(auVar27,auVar26._0_16_);
                  auVar26 = ZEXT1664(auVar7);
                  if (dVar24 < auVar27._0_8_) {
                    uVar22 = uVar18 & 0xffffffff;
                  }
                  uVar14 = (uint)uVar22;
                  uVar18 = uVar18 + 1;
                } while (lVar20 + (ulong)(lVar20 == 0) != uVar18);
              }
              ppNVar6 = (local_328->nodes).
                        super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ppNVar6[(long)local_3a0]->dim).d[local_378 - 8] == uVar14) {
                auVar26 = ZEXT864((ulong)(*(double *)predict + 1.0));
                *(double *)predict = *(double *)predict + 1.0;
              }
              cnn::expr::pickneglogsoftmax
                        ((expr *)&local_320,&local_2c0,
                         (ppNVar6[(long)local_3a0]->dim).d[local_378 - 8]);
              std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
              emplace_back<cnn::expr::Expression>(&local_218,(Expression *)&local_320);
              if (local_418 != (undefined1  [8])0x0) {
                operator_delete((void *)local_418);
              }
              local_388 = CONCAT44(local_388._4_4_,(int)local_388 + 1);
            }
            if ((ComputationGraph *)local_3b8._0_8_ != (ComputationGraph *)0x0) {
              operator_delete((void *)local_3b8._0_8_);
            }
            local_378 = (ulong)(int)local_388;
            ppNVar6 = (local_328->nodes).
                      super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar22 = (long)ppNVar6[(long)((long)&(local_3a0->
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1)] -
                     (long)ppNVar6[(long)local_3a0] >> 2;
          } while (local_378 < uVar22);
        }
        pvVar16 = local_3a0;
        if (overall != (uint *)0x0) {
          pvVar16 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)(local_388 & 0xffffffff);
          *overall = *overall + (int)local_388;
        }
        piVar8 = (int *)CONCAT71(in_stack_00000019,train);
        if (piVar8 != (int *)0x0) {
          *piVar8 = *piVar8 + (int)uVar22;
        }
      }
      local_398 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)((long)&(local_398->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_398 != local_298);
  }
  pRVar10 = local_1a0;
  cnn::expr::detail::
  f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((detail *)local_1a0,&local_218);
  if (local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_240.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_150.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_198);
  if (local_120.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_1d0);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_180);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_2d8);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_308);
  uVar17 = extraout_RDX;
  if (local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar17 = extraout_RDX_00;
  }
  EVar29._8_8_ = uVar17;
  EVar29.pg = (ComputationGraph *)pRVar10;
  return EVar29;
}

Assistant:

Expression BuildTaggingGraph(const vector<int>& sent, const vector< vector<int> >& chars, const vector< vector<int> >& labels, ComputationGraph& cg, double* cor = 0, unsigned* predict = 0, unsigned* overall = 0, bool train=true) {
    const unsigned slen = sent.size();
    l2rbuilder.new_graph(cg);  // reset RNN builder for new graph
    l2rbuilder.start_new_sequence();
    r2lbuilder.new_graph(cg);  // reset RNN builder for new graph
    r2lbuilder.start_new_sequence();
    
    Expression i_wordpadding_2 = parameter(cg, p_wordpadding_2);
    Expression i_wordpadding_1 = parameter(cg, p_wordpadding_1);
    Expression i_wordpadding2 = parameter(cg, p_wordpadding2);
    Expression i_wordpadding1 = parameter(cg, p_wordpadding1);

    Expression i_charpadding_2 = parameter(cg, p_charpadding_2);
    Expression i_charpadding_1 = parameter(cg, p_charpadding_1);
    Expression i_charpadding2 = parameter(cg, p_charpadding2);
    Expression i_charpadding1 = parameter(cg, p_charpadding1);
  
    Expression i_charw2charh = parameter(cg, p_charw2charh);
    Expression i_charhbias = parameter(cg, p_charhbias);
    //attention pooling
    Expression i_charh2xMExp = parameter(cg, p_charh2xMExp);
    Expression i_word2xMExp = parameter(cg, p_word2xMExp);
    Expression i_xMExpbias = parameter(cg, p_xMExpbias);
    Expression i_xMExp2xExp = parameter(cg, p_xMExp2xExp);
    //
    
    // Expression i_l2oh = parameter(cg, p_l2oh);
    // Expression i_r2oh = parameter(cg, p_r2oh);
    // Expression i_ohbias = parameter(cg, p_ohbias);

    //attention labeling
    Expression i_oh2ohxMExp = parameter(cg, p_oh2ohxMExp);
    Expression oh2ohxMExp = parameter(cg, p_osh2ohxMExp);
    Expression i_u = parameter(cg, p_u);

    Expression i_oh2lh = parameter(cg, p_oh2lh);
    Expression i_lhbias = parameter(cg, p_lhbias);

    Expression i_lh2l = parameter(cg, p_lh2l);

    vector<Expression> i_word(slen);

    vector< vector<Expression> > i_char(slen);
    vector< vector<Expression> > i_charw(slen);
    vector< vector<Expression> > i_charh(slen);
    //attention pooling
    vector< vector<Expression> > i_charxMExp(slen);
    vector< vector<Expression> > i_charxExp(slen);
    vector< Expression > i_charSum(slen);
    vector< vector<Expression> > i_charPool(slen);
    vector< Expression > i_charinput(slen);
    //

    vector< Expression > i_input(slen);
    vector< Expression > i_inputw(slen);

    vector<Expression> fwds(slen);
    vector<Expression> revs(slen);
    vector<Expression> i_oh(slen);

    vector<Expression> errs; 
    for (unsigned i = 0; i < slen; ++i) {
      i_word[i] = lookup(cg, p_w, sent[i]);
      if (!eval) { i_word[i] = dropout(i_word[i], pdrop); }
      i_char[i].resize(chars[i].size());
      for (unsigned j = 0; j < chars[i].size(); ++j) {
        i_char[i][j] = lookup(cg, p_c, chars[i][j]);
        if (!eval) { i_char[i][j] = dropout(i_char[i][j], pdrop); }
      }
//      cerr<<"lookup done"<<endl;
      i_charw[i].resize(i_char[i].size());
      i_charh[i].resize(i_char[i].size());
      i_charxMExp[i].resize(i_char[i].size());
      i_charxExp[i].resize(i_char[i].size());
      for (int j = 0; j < i_char[i].size(); ++j) {
        if ( j-1 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_charpadding1, i_charpadding2});
	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
  	}
	else if ( j-2 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
    	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
        }
  	else{
	  if ( j+1 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
          else if ( j+2 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
          else 
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
	}
	i_charh[i][j] = tanh(affine_transform({i_charhbias, i_charw2charh ,i_charw[i][j]}));
	i_charxMExp[i][j] = tanh(affine_transform({i_xMExpbias, i_charh2xMExp, i_charh[i][j], i_word2xMExp, i_word[i]}));
	i_charxExp[i][j] = exp(i_xMExp2xExp * i_charxMExp[i][j]);
      }
      i_charSum[i] = sum(i_charxExp[i]);
      i_charPool[i].resize(i_char[i].size());
      for (unsigned j = 0; j < i_char[i].size(); ++j){
        i_charPool[i][j] = cwise_multiply(i_charh[i][j], cdiv(i_charxExp[i][j], i_charSum[i]));
      }
      i_charinput[i] = sum(i_charPool[i]);
    }
//    cerr<<"input done"<<endl;
    for (unsigned i = 0; i < slen; ++i) {
      i_input[i] = concatenate({i_charinput[i], i_word[i]});
    }
//    cerr<<"concatenate done"<<endl;
    for (int i = 0; i < slen; ++i) {
      if(i-1 < 0){
        if(i+1>= slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_wordpadding1, i_wordpadding2});
	}
   	else if(i+2>=slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_wordpadding1});
	}
 	else{
 	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_input[i+2]});
	}
      }
      else if(i-2<0){
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
      else{
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
    }
//    cerr<<"intput windows done "<<INPUT_WINDOWS_DIM<<endl;
    for (unsigned i = 0; i < slen; ++i)
      fwds[i] = l2rbuilder.add_input(i_inputw[i]);
    for (unsigned i = 0; i < slen; ++i)
      revs[slen - i - 1] = r2lbuilder.add_input(i_inputw[slen - i - 1]);   
//    cerr<<"lstm done"<<endl;
    for (unsigned i = 0; i < slen; ++i)
      //i_oh[i] = tanh(affine_transform({i_ohbias, i_l2oh, fwds[i], i_r2oh, revs[i]}));
        i_oh[i] = concatenate({fwds[i], revs[i]});

    for (unsigned i = 0; i < slen; ++i) {
   //   cerr<<i<<endl;
      orderbuilder.new_graph(cg);
      orderbuilder.start_new_sequence();
      if(train) {
	int j = 0;

	Expression oh = zeroes(cg, {HIDDEN_DIM});

	while(j < labels[i].size()){
	  //attention
	  Expression i_att_oh;
      	  vector<Expression> alpha_i(slen);
	  for (unsigned att = 0; att < slen; ++att){
	    alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
   	  }

  	  Expression input_cols = concatenate_cols(i_oh);
	  Expression alpha = softmax(concatenate(alpha_i));
    	  i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );
	  
	  Expression combine_h = concatenate({i_oh[i], i_att_oh});
	  oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
            for (int k = 0; k < dist.size(); ++k) {
              if(dist[k] > best) {best = dist[k]; bestk = k; }
            }
            if (labels[i][j] == bestk) (*cor)++;
	    errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
            j += 1;
	  } 
	}
        if(predict) (*predict) += j;
        if(overall) (*overall) += labels[i].size();
      }
      else{
	int j = 0;
	
	Expression oh = zeroes(cg, {HIDDEN_DIM});

        while(j < 13) {
	  //attention
	  Expression i_att_oh;
          vector<Expression> alpha_i(slen);
          for (unsigned att = 0; att < slen; ++att){
            alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
          }

          Expression input_cols = concatenate_cols(i_oh);
          Expression alpha = softmax(concatenate(alpha_i));
          i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );

          Expression combine_h = concatenate({i_oh[i], i_att_oh});
          oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
	    for (int k = 0; k < dist.size(); ++k) {
	      if(dist[k] > best) {best = dist[k]; bestk = k; }
   	    }
	    if (j < labels[i].size() && labels[i][j] == bestk) (*cor)++;
	  
	    if (j < labels[i].size()) errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
	    else errs.push_back(pickneglogsoftmax(i_l, labels[i][labels[i].size()-1]));
	    j += 1;
	    if(bestk == endlabel) break;
	  }
       }
       if(predict) (*predict) += j;
       if(overall) (*overall) += labels[i].size();
     }
    }
//    cerr<<"errs done"<<endl;
    return sum(errs);
  }